

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand
          (cmGlobalUnixMakefileGenerator3 *this,string *sourceFile,string *workingDirectory,
          string *compileCommand)

{
  cmake *this_00;
  char *pcVar1;
  cmGeneratedFileStream *this_01;
  ostream *poVar2;
  string local_e0;
  string local_c0;
  string local_a0;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string commandDatabaseName;
  string *compileCommand_local;
  string *workingDirectory_local;
  string *sourceFile_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  commandDatabaseName.field_2._8_8_ = compileCommand;
  if (this->CommandDatabase == (cmGeneratedFileStream *)0x0) {
    this_00 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    pcVar1 = cmake::GetHomeOutputDirectory(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,"/compile_commands.json");
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    this_01 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream(this_01,pcVar1,false);
    this->CommandDatabase = this_01;
    poVar2 = std::operator<<((ostream *)this->CommandDatabase,"[");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    poVar2 = std::operator<<((ostream *)this->CommandDatabase,",");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)this->CommandDatabase,"{");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_a0,workingDirectory);
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  poVar2 = std::operator<<(poVar2,"\",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_c0,(string *)commandDatabaseName.field_2._8_8_);
  poVar2 = std::operator<<(poVar2,(string *)&local_c0);
  poVar2 = std::operator<<(poVar2,"\",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_e0,sourceFile);
  poVar2 = std::operator<<(poVar2,(string *)&local_e0);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand(
    const std::string &sourceFile, const std::string &workingDirectory,
    const std::string &compileCommand) {
  if (this->CommandDatabase == NULL)
    {
    std::string commandDatabaseName =
      std::string(this->GetCMakeInstance()->GetHomeOutputDirectory())
      + "/compile_commands.json";
    this->CommandDatabase =
      new cmGeneratedFileStream(commandDatabaseName.c_str());
    *this->CommandDatabase << "[" << std::endl;
    } else {
    *this->CommandDatabase << "," << std::endl;
    }
  *this->CommandDatabase << "{" << std::endl
      << "  \"directory\": \""
      << cmGlobalGenerator::EscapeJSON(workingDirectory) << "\","
      << std::endl
      << "  \"command\": \"" <<
      cmGlobalGenerator::EscapeJSON(compileCommand) << "\","
      << std::endl
      << "  \"file\": \"" <<
      cmGlobalGenerator::EscapeJSON(sourceFile) << "\""
      << std::endl << "}";
}